

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

DecodePsbtLockingScriptStruct * __thiscall
cfd::api::json::DecodePsbtLockingScript::ConvertToStruct(DecodePsbtLockingScript *this)

{
  long in_RSI;
  DecodePsbtLockingScriptStruct *in_RDI;
  DecodePsbtLockingScriptStruct *in_stack_00000010;
  DecodePsbtLockingScriptStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  DecodePsbtLockingScriptStruct *this_00;
  
  this_00 = in_RDI;
  DecodePsbtLockingScriptStruct::DecodePsbtLockingScriptStruct(in_stack_00000010);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->hex,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->type,(string *)(in_RSI + 0x78));
  std::__cxx11::string::operator=((string *)&in_RDI->address,(string *)(in_RSI + 0x98));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

DecodePsbtLockingScriptStruct DecodePsbtLockingScript::ConvertToStruct() const {  // NOLINT
  DecodePsbtLockingScriptStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.type = type_;
  result.address = address_;
  result.ignore_items = ignore_items;
  return result;
}